

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_str_delete_chars(nk_str *s,int pos,int len)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  nk_size nVar5;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1b9d,"void nk_str_delete_chars(struct nk_str *, int, int)");
  }
  if (len != 0) {
    uVar1 = (s->buffer).allocated;
    if ((ulong)(long)pos <= uVar1) {
      uVar4 = (ulong)(pos + len);
      if (uVar1 >= uVar4) {
        if (uVar1 < uVar4 || uVar1 - uVar4 == 0) {
          nk_str_remove_chars(s,len);
          nVar5 = (s->buffer).allocated;
        }
        else {
          pvVar2 = (s->buffer).memory.ptr;
          nk_memcopy((void *)((long)pos + (long)pvVar2),(void *)(uVar4 + (long)pvVar2),uVar1 - uVar4
                    );
          nVar5 = (s->buffer).allocated;
          if ((int)nVar5 < len) {
            __assert_fail("((int)s->buffer.allocated - (int)len) >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                          ,0x1ba6,"void nk_str_delete_chars(struct nk_str *, int, int)");
          }
          nVar5 = nVar5 - (long)len;
          (s->buffer).allocated = nVar5;
        }
        iVar3 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)nVar5);
        s->len = iVar3;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_str_delete_chars(struct nk_str *s, int pos, int len)
{
    NK_ASSERT(s);
    if (!s || !len || (nk_size)pos > s->buffer.allocated ||
        (nk_size)(pos + len) > s->buffer.allocated) return;

    if ((nk_size)(pos + len) < s->buffer.allocated) {
        /* memmove */
        char *dst = nk_ptr_add(char, s->buffer.memory.ptr, pos);
        char *src = nk_ptr_add(char, s->buffer.memory.ptr, pos + len);
        NK_MEMCPY(dst, src, s->buffer.allocated - (nk_size)(pos + len));
        NK_ASSERT(((int)s->buffer.allocated - (int)len) >= 0);
        s->buffer.allocated -= (nk_size)len;
    } else nk_str_remove_chars(s, len);
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
}